

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O3

int Dau_DsdBalance(Gia_Man_t *pGia,int *pFans,int nFans,int fAnd)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  uint iCtrl;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  if (nFans != 1) {
    uVar10 = (ulong)(uint)nFans;
    do {
      if ((int)uVar10 < 2) {
        __assert_fail("nFans > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                      ,0xee,"int Dau_DsdBalance(Gia_Man_t *, int *, int, int)");
      }
      iCtrl = pFans[uVar10 - 1];
      uVar1 = uVar10 - 2;
      uVar3 = pFans[uVar1 & 0xffffffff];
      if ((pGia->vHTable).nSize == 0) {
        if (fAnd == 0) {
          if (pGia->pMuxes == (uint *)0x0) {
            if ((int)uVar3 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            iCtrl = Gia_ManAppendMux2(pGia,iCtrl,uVar3 ^ 1,uVar3);
          }
          else {
            if (((int)iCtrl < 0) || ((int)uVar3 < 0)) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            pGVar6 = Gia_ManAppendObj(pGia);
            uVar11 = iCtrl >> 1;
            uVar5 = pGia->nObjs;
            if ((int)uVar5 <= (int)uVar11) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            uVar7 = uVar3 >> 1;
            if (uVar5 <= uVar7) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            if (uVar11 == uVar7) {
              __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            pGVar2 = pGia->pObjs;
            iVar4 = (int)pGVar6;
            if (uVar7 < uVar11) {
              if (pGVar2 + uVar5 <= pGVar6 || pGVar6 < pGVar2) goto LAB_00511d97;
              uVar9 = (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar11 & 0x1fffffff
                             ) | *(ulong *)pGVar6 & 0xffffffffc0000000;
              *(ulong *)pGVar6 = uVar9;
              pGVar2 = pGia->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar6)) goto LAB_00511d97;
              uVar12 = (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff
                              ) << 0x20;
              uVar8 = 0xc0000000dfffffff;
            }
            else {
              if (pGVar2 + uVar5 <= pGVar6 || pGVar6 < pGVar2) goto LAB_00511d97;
              uVar9 = *(ulong *)pGVar6 & 0xc0000000ffffffff |
                      (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar11 & 0x1fffffff
                             ) << 0x20;
              *(ulong *)pGVar6 = uVar9;
              pGVar2 = pGia->pObjs;
              if ((pGVar6 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar6)) goto LAB_00511d97;
              uVar12 = (ulong)(((uint)(iVar4 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff
                              );
              uVar8 = 0xdfffffffc0000000;
            }
            *(ulong *)pGVar6 = uVar9 & uVar8 | uVar12;
            pGia->nXors = pGia->nXors + 1;
            pGVar2 = pGia->pObjs;
            if ((pGVar6 < pGVar2) || (pGVar2 + pGia->nObjs <= pGVar6)) {
LAB_00511d97:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar5 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
            if ((int)uVar5 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            iCtrl = uVar5 | (uVar3 ^ iCtrl) & 1;
          }
        }
        else {
          if (pGia->fGiaSimple != 0) {
LAB_005119c9:
            uVar3 = Gia_ManAppendAnd(pGia,iCtrl,uVar3);
            goto LAB_00511b03;
          }
          if ((int)iCtrl < 2) {
            if (iCtrl != 0) goto LAB_00511b03;
LAB_00511d33:
            iCtrl = 0;
          }
          else if ((int)uVar3 < 2) {
            if (uVar3 == 0) {
              iCtrl = uVar3;
            }
          }
          else if (iCtrl != uVar3) {
            if ((uVar3 ^ iCtrl) != 1) goto LAB_005119c9;
            goto LAB_00511d33;
          }
        }
      }
      else {
        if (fAnd == 0) {
          if (pGia->pMuxes == (uint *)0x0) {
            uVar3 = Gia_ManHashXor(pGia,iCtrl,uVar3);
          }
          else {
            uVar3 = Gia_ManHashXorReal(pGia,iCtrl,uVar3);
          }
        }
        else {
          uVar3 = Gia_ManHashAnd(pGia,iCtrl,uVar3);
        }
LAB_00511b03:
        iCtrl = uVar3;
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
      }
      uVar3 = iCtrl >> 1;
      if (pGia->nObjs <= (int)uVar3) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar9 = *(ulong *)(pGia->pObjs + uVar3);
      uVar8 = uVar9 & 0x1fffffff;
      if (uVar8 != 0x1fffffff && -1 < (int)uVar9) {
        pGVar6 = pGia->pObjs + uVar3;
        if (fAnd == 0) {
          if (pGia->pMuxes != (uint *)0x0) {
            Gia_ObjSetXorLevel(pGia,pGVar6);
            goto LAB_00511b73;
          }
          if ((~*(uint *)(pGVar6 + -uVar8) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar6 + -uVar8)) {
            Gia_ObjSetAndLevel(pGia,pGVar6 + -uVar8);
            uVar9 = *(ulong *)pGVar6;
          }
          uVar9 = (ulong)((uint)(uVar9 >> 0x20) & 0x1fffffff);
          if ((~*(uint *)(pGVar6 + -uVar9) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar6 + -uVar9)) {
            Gia_ObjSetAndLevel(pGia,pGVar6 + -uVar9);
          }
        }
        Gia_ObjSetAndLevel(pGia,pGVar6);
      }
LAB_00511b73:
      uVar10 = uVar10 - 1;
      Dau_DsdAddToArray(pGia,pFans,(int)uVar1,iCtrl);
    } while (uVar10 != 1);
  }
  return *pFans;
}

Assistant:

int Dau_DsdBalance( Gia_Man_t * pGia, int * pFans, int nFans, int fAnd )
{
    Gia_Obj_t * pObj;
    int iFan0, iFan1, iFan;
    if ( nFans == 1 )
        return pFans[0];
    assert( nFans > 1 );
    iFan0 = pFans[--nFans];
    iFan1 = pFans[--nFans];
    if ( Vec_IntSize(&pGia->vHTable) == 0 )
    {
        if ( fAnd )
            iFan = Gia_ManAppendAnd2( pGia, iFan0, iFan1 );
        else if ( pGia->pMuxes )
        {
            int fCompl = Abc_LitIsCompl(iFan0) ^ Abc_LitIsCompl(iFan1);
            iFan = Gia_ManAppendXorReal( pGia, Abc_LitRegular(iFan0), Abc_LitRegular(iFan1) );
            iFan = Abc_LitNotCond( iFan, fCompl );
        }
        else 
            iFan = Gia_ManAppendXor2( pGia, iFan0, iFan1 );
    }
    else
    {
        if ( fAnd )
            iFan = Gia_ManHashAnd( pGia, iFan0, iFan1 );
        else if ( pGia->pMuxes )
            iFan = Gia_ManHashXorReal( pGia, iFan0, iFan1 );
        else 
            iFan = Gia_ManHashXor( pGia, iFan0, iFan1 );
    }
    pObj = Gia_ManObj(pGia, Abc_Lit2Var(iFan));
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( fAnd )
            Gia_ObjSetAndLevel( pGia, pObj );
        else if ( pGia->pMuxes )
            Gia_ObjSetXorLevel( pGia, pObj );
        else 
        {
            if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
            if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
            Gia_ObjSetAndLevel( pGia, pObj );
        }
    }
    Dau_DsdAddToArray( pGia, pFans, nFans++, iFan );
    return Dau_DsdBalance( pGia, pFans, nFans, fAnd );
}